

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O0

Result __thiscall
testing::internal::FunctionMocker<std::error_code_(bool)>::Invoke
          (FunctionMocker<std::error_code_(bool)> *this,bool args)

{
  tuple<bool> *this_00;
  UntypedActionResultHolderBase *f;
  ActionResultHolder<std::error_code> *__p;
  pointer this_01;
  error_code eVar1;
  Result RVar2;
  unique_ptr<testing::internal::ActionResultHolder<std::error_code>,_std::default_delete<testing::internal::ActionResultHolder<std::error_code>_>_>
  local_30;
  unique_ptr<testing::internal::ActionResultHolder<std::error_code>,_std::default_delete<testing::internal::ActionResultHolder<std::error_code>_>_>
  holder;
  ArgumentTuple tuple;
  bool args_local;
  FunctionMocker<std::error_code_(bool)> *this_local;
  
  this_00 = (tuple<bool> *)
            ((long)&holder._M_t.
                    super___uniq_ptr_impl<testing::internal::ActionResultHolder<std::error_code>,_std::default_delete<testing::internal::ActionResultHolder<std::error_code>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_testing::internal::ActionResultHolder<std::error_code>_*,_std::default_delete<testing::internal::ActionResultHolder<std::error_code>_>_>
                    .
                    super__Head_base<0UL,_testing::internal::ActionResultHolder<std::error_code>_*,_false>
                    ._M_head_impl + 6);
  holder._M_t.
  super___uniq_ptr_impl<testing::internal::ActionResultHolder<std::error_code>,_std::default_delete<testing::internal::ActionResultHolder<std::error_code>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_testing::internal::ActionResultHolder<std::error_code>_*,_std::default_delete<testing::internal::ActionResultHolder<std::error_code>_>_>
  .super__Head_base<0UL,_testing::internal::ActionResultHolder<std::error_code>_*,_false>.
  _M_head_impl._7_1_ = args;
  std::tuple<bool>::tuple<bool,_true,_true>
            (this_00,(bool *)((long)&holder._M_t.
                                     super___uniq_ptr_impl<testing::internal::ActionResultHolder<std::error_code>,_std::default_delete<testing::internal::ActionResultHolder<std::error_code>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_testing::internal::ActionResultHolder<std::error_code>_*,_std::default_delete<testing::internal::ActionResultHolder<std::error_code>_>_>
                                     .
                                     super__Head_base<0UL,_testing::internal::ActionResultHolder<std::error_code>_*,_false>
                                     ._M_head_impl + 7));
  f = UntypedFunctionMockerBase::UntypedInvokeWith(&this->super_UntypedFunctionMockerBase,this_00);
  __p = DownCast_<testing::internal::ActionResultHolder<std::error_code>*,testing::internal::UntypedActionResultHolderBase>
                  (f);
  std::
  unique_ptr<testing::internal::ActionResultHolder<std::error_code>,std::default_delete<testing::internal::ActionResultHolder<std::error_code>>>
  ::unique_ptr<std::default_delete<testing::internal::ActionResultHolder<std::error_code>>,void>
            ((unique_ptr<testing::internal::ActionResultHolder<std::error_code>,std::default_delete<testing::internal::ActionResultHolder<std::error_code>>>
              *)&local_30,__p);
  this_01 = std::
            unique_ptr<testing::internal::ActionResultHolder<std::error_code>,_std::default_delete<testing::internal::ActionResultHolder<std::error_code>_>_>
            ::operator->(&local_30);
  eVar1 = ActionResultHolder<std::error_code>::Unwrap(this_01);
  RVar2._M_cat = eVar1._M_cat;
  RVar2._M_value = eVar1._M_value;
  std::
  unique_ptr<testing::internal::ActionResultHolder<std::error_code>,_std::default_delete<testing::internal::ActionResultHolder<std::error_code>_>_>
  ::~unique_ptr(&local_30);
  RVar2._4_4_ = 0;
  return RVar2;
}

Assistant:

GTEST_LOCK_EXCLUDED_(g_gmock_mutex) {
    ArgumentTuple tuple(std::forward<Args>(args)...);
    std::unique_ptr<ResultHolder> holder(DownCast_<ResultHolder*>(
        this->UntypedInvokeWith(static_cast<void*>(&tuple))));
    return holder->Unwrap();
  }